

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int doctest::anon_unknown_14::wildcmp(char *str,char *wild,bool caseSensitive)

{
  int iVar1;
  int iVar2;
  byte in_DL;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *mp;
  char *cp;
  char *local_30;
  char *local_28;
  char *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    bVar3 = false;
    if (*local_10 != '\0') {
      bVar3 = *local_18 != '*';
    }
    local_30 = in_RSI;
    local_28 = in_RDI;
    if (!bVar3) break;
    if ((in_DL & 1) == 0) {
      iVar1 = tolower((int)*local_18);
      iVar2 = tolower((int)*local_10);
      if (iVar1 != iVar2) goto LAB_00112eae;
    }
    else if (*local_18 != *local_10) {
LAB_00112eae:
      if (*local_18 != '?') {
        return 0;
      }
    }
    local_18 = local_18 + 1;
    local_10 = local_10 + 1;
  }
  do {
    while( true ) {
      while( true ) {
        if (*local_10 == '\0') {
          for (; *local_18 == '*'; local_18 = local_18 + 1) {
          }
          return (uint)((*local_18 != '\0' ^ 0xffU) & 1);
        }
        if (*local_18 != '*') break;
        local_30 = local_18 + 1;
        if (local_18[1] == '\0') {
          return 1;
        }
        local_28 = local_10 + 1;
        local_18 = local_30;
      }
      if ((in_DL & 1) != 0) break;
      iVar1 = tolower((int)*local_18);
      iVar2 = tolower((int)*local_10);
      if (iVar1 != iVar2) goto LAB_00112f8c;
LAB_00112f99:
      local_18 = local_18 + 1;
      local_10 = local_10 + 1;
    }
    if (*local_18 == *local_10) goto LAB_00112f99;
LAB_00112f8c:
    if (*local_18 == '?') goto LAB_00112f99;
    local_18 = local_30;
    local_10 = local_28;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int wildcmp(const char* str, const char* wild, bool caseSensitive) {
        const char* cp = str;
        const char* mp = wild;

        while((*str) && (*wild != '*')) {
            if((caseSensitive ? (*wild != *str) : (tolower(*wild) != tolower(*str))) &&
               (*wild != '?')) {
                return 0;
            }
            wild++;
            str++;
        }

        while(*str) {
            if(*wild == '*') {
                if(!*++wild) {
                    return 1;
                }
                mp = wild;
                cp = str + 1;
            } else if((caseSensitive ? (*wild == *str) : (tolower(*wild) == tolower(*str))) ||
                      (*wild == '?')) {
                wild++;
                str++;
            } else {
                wild = mp;   //!OCLINT parameter reassignment
                str  = cp++; //!OCLINT parameter reassignment
            }
        }

        while(*wild == '*') {
            wild++;
        }
        return !*wild;
    }